

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgloadr.c
# Opt level: O0

FT_Error FT_GlyphLoader_CheckSubGlyphs(FT_GlyphLoader loader,FT_UInt n_subs)

{
  uint uVar1;
  FT_SubGlyph pFVar2;
  FT_GlyphLoad current;
  FT_GlyphLoad base;
  FT_UInt old_max;
  FT_UInt new_max;
  FT_Error error;
  FT_Memory memory;
  FT_GlyphLoader pFStack_10;
  FT_UInt n_subs_local;
  FT_GlyphLoader loader_local;
  
  _new_max = loader->memory;
  old_max = 0;
  uVar1 = (loader->base).num_subglyphs + (loader->current).num_subglyphs + n_subs;
  if (loader->max_subglyphs < uVar1) {
    uVar1 = uVar1 + 1 & 0xfffffffe;
    memory._4_4_ = n_subs;
    pFStack_10 = loader;
    pFVar2 = (FT_SubGlyph)
             ft_mem_realloc(_new_max,0x30,(ulong)loader->max_subglyphs,(ulong)uVar1,
                            (loader->base).subglyphs,(FT_Error *)&old_max);
    (loader->base).subglyphs = pFVar2;
    if (old_max == 0) {
      pFStack_10->max_subglyphs = uVar1;
      FT_GlyphLoader_Adjust_Subglyphs(pFStack_10);
    }
  }
  return old_max;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_GlyphLoader_CheckSubGlyphs( FT_GlyphLoader  loader,
                                 FT_UInt         n_subs )
  {
    FT_Memory     memory = loader->memory;
    FT_Error      error  = FT_Err_Ok;
    FT_UInt       new_max, old_max;

    FT_GlyphLoad  base    = &loader->base;
    FT_GlyphLoad  current = &loader->current;


    new_max = base->num_subglyphs + current->num_subglyphs + n_subs;
    old_max = loader->max_subglyphs;
    if ( new_max > old_max )
    {
      new_max = FT_PAD_CEIL( new_max, 2 );
      if ( FT_RENEW_ARRAY( base->subglyphs, old_max, new_max ) )
        goto Exit;

      loader->max_subglyphs = new_max;

      FT_GlyphLoader_Adjust_Subglyphs( loader );
    }

  Exit:
    return error;
  }